

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

bool __thiscall
dg::llvmdg::legacy::GraphBuilder::createPthreadJoin
          (GraphBuilder *this,CallInst *callInst,Block *lastBlock)

{
  Function *llvmFunction_00;
  Function *function;
  bool bVar1;
  undefined8 *puVar2;
  Function *llvmFunction;
  ForkJoinAnalysis FJA;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> joinFunctions;
  undefined8 *local_48;
  undefined8 *local_40;
  
  dg::ForkJoinAnalysis::joinFunctions((Value *)&local_48);
  bVar1 = false;
  for (puVar2 = local_48; puVar2 != local_40; puVar2 = puVar2 + 1) {
    llvmFunction_00 = (Function *)*puVar2;
    if (*(Function **)(llvmFunction_00 + 0x48) != llvmFunction_00 + 0x48) {
      function = createOrGetFunction(this,llvmFunction_00);
      Block::addJoin(lastBlock,llvmFunction_00,function);
      bVar1 = true;
    }
  }
  std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
            ((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)&local_48);
  return bVar1;
}

Assistant:

bool GraphBuilder::createPthreadJoin(const llvm::CallInst *callInst,
                                     Block *lastBlock) {
    bool createCallReturn = false;

    // FIXME: create this as attibute so that we perform the analysis only once
    // (now we do not care as we just forward the results of PTA, but in the
    // future...)
    ForkJoinAnalysis FJA{pointsToAnalysis_};
    auto joinFunctions = FJA.joinFunctions(callInst);
    for (const auto *joinFunction : joinFunctions) {
        const auto *llvmFunction = llvm::cast<llvm::Function>(joinFunction);
        if (!llvmFunction->empty()) {
            auto *func = createOrGetFunction(llvmFunction);
            lastBlock->addJoin(llvmFunction, func);
            createCallReturn |= true;
        }
    }
    return createCallReturn;
}